

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall testing::internal::GTestFlagSaver::~GTestFlagSaver(GTestFlagSaver *this)

{
  String *in_RDI;
  String *unaff_retaddr;
  String *rhs;
  
  FLAGS_gtest_also_run_disabled_tests = *(byte *)&in_RDI->c_str_ & 1;
  FLAGS_gtest_break_on_failure = *(byte *)((long)&in_RDI->c_str_ + 1) & 1;
  FLAGS_gtest_catch_exceptions = *(byte *)((long)&in_RDI->c_str_ + 2) & 1;
  rhs = in_RDI;
  String::operator=(unaff_retaddr,in_RDI);
  String::operator=(unaff_retaddr,rhs);
  FLAGS_gtest_death_test_use_fork = (byte)in_RDI[2].length_ & 1;
  String::operator=(unaff_retaddr,rhs);
  String::operator=(unaff_retaddr,rhs);
  FLAGS_gtest_list_tests = *(byte *)&in_RDI[5].c_str_ & 1;
  String::operator=(unaff_retaddr,rhs);
  FLAGS_gtest_print_time = (byte)in_RDI[6].length_ & 1;
  FLAGS_gtest_random_seed = *(undefined4 *)((long)&in_RDI[6].length_ + 4);
  FLAGS_gtest_repeat = *(undefined4 *)&in_RDI[7].c_str_;
  FLAGS_gtest_shuffle = *(byte *)((long)&in_RDI[7].c_str_ + 4) & 1;
  FLAGS_gtest_stack_trace_depth = (undefined4)in_RDI[7].length_;
  String::operator=(unaff_retaddr,rhs);
  FLAGS_gtest_throw_on_failure = *(byte *)&in_RDI[9].c_str_ & 1;
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  String::~String(in_RDI);
  return;
}

Assistant:

~GTestFlagSaver() {
    GTEST_FLAG(also_run_disabled_tests) = also_run_disabled_tests_;
    GTEST_FLAG(break_on_failure) = break_on_failure_;
    GTEST_FLAG(catch_exceptions) = catch_exceptions_;
    GTEST_FLAG(color) = color_;
    GTEST_FLAG(death_test_style) = death_test_style_;
    GTEST_FLAG(death_test_use_fork) = death_test_use_fork_;
    GTEST_FLAG(filter) = filter_;
    GTEST_FLAG(internal_run_death_test) = internal_run_death_test_;
    GTEST_FLAG(list_tests) = list_tests_;
    GTEST_FLAG(output) = output_;
    GTEST_FLAG(print_time) = print_time_;
    GTEST_FLAG(random_seed) = random_seed_;
    GTEST_FLAG(repeat) = repeat_;
    GTEST_FLAG(shuffle) = shuffle_;
    GTEST_FLAG(stack_trace_depth) = stack_trace_depth_;
    GTEST_FLAG(stream_result_to) = stream_result_to_;
    GTEST_FLAG(throw_on_failure) = throw_on_failure_;
  }